

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void n_array_suite::n_array_extra_close(void)

{
  undefined4 local_1d0;
  value local_1cc [2];
  undefined4 local_1c4;
  value local_1c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [7];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_3_ = 0x5d5d;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x2278225b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x23e,"void n_array_suite::n_array_extra_close()",local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_18c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_190 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x240,"void n_array_suite::n_array_extra_close()",local_18c,&local_190);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_1b8,(basic_reader<char> *)local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("reader.value<std::string>()","\"x\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x241,"void n_array_suite::n_array_extra_close()",&local_1b8,"x");
  std::__cxx11::string::~string((string *)&local_1b8);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1c0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1c4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x243,"void n_array_suite::n_array_extra_close()",local_1c0,&local_1c4);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1cc[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1d0 = 0xfffffffb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unbalanced_end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x245,"void n_array_suite::n_array_extra_close()",local_1cc,&local_1d0);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void n_array_extra_close()
{
    const char input[] = "[\"x\"]]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "x");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unbalanced_end_array);
}